

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O0

void __thiscall FlowInfo::collectEdges(FlowInfo *this)

{
  bool bVar1;
  int4 iVar2;
  OpCode OVar3;
  RecovError *this_00;
  reference ppPVar4;
  iterator local_e8;
  _List_const_iterator<PcodeOp_*> local_e0;
  iterator local_d8;
  _List_const_iterator<PcodeOp_*> local_d0;
  iterator local_c8;
  _List_const_iterator<PcodeOp_*> local_c0;
  undefined1 local_b8 [64];
  string local_78 [36];
  int local_54;
  int local_50;
  int4 num;
  int4 i;
  bool nextstart;
  JumpTable *jt;
  PcodeOp *targ_op;
  PcodeOp *op;
  const_iterator iter2;
  const_iterator iter1;
  const_iterator iterend;
  const_iterator iter;
  FlowInfo *this_local;
  
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&iterend);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&iter1);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&iter2);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator((_List_const_iterator<PcodeOp_*> *)&op)
  ;
  iVar2 = BlockGraph::getSize(this->bblocks);
  if (iVar2 != 0) {
    local_b8[0x2b] = 1;
    this_00 = (RecovError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"Basic blocks already calculated\n",(allocator *)(local_b8 + 0x3f));
    RecovError::RecovError(this_00,(string *)local_78);
    local_b8[0x2b] = 0;
    __cxa_throw(this_00,&RecovError::typeinfo,RecovError::~RecovError);
  }
  local_b8._32_8_ = PcodeOpBank::beginDead(this->obank);
  iterend._M_node = (_List_node_base *)local_b8._32_8_;
  local_b8._24_8_ = PcodeOpBank::endDead(this->obank);
  iter1 = (const_iterator)local_b8._24_8_;
  do {
    bVar1 = std::operator!=(&iterend,&iter1);
    if (!bVar1) {
      return;
    }
    local_b8._16_8_ = std::_List_const_iterator<PcodeOp_*>::operator++(&iterend,0);
    ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*
                        ((_List_const_iterator<PcodeOp_*> *)(local_b8 + 0x10));
    targ_op = *ppPVar4;
    bVar1 = std::operator==(&iterend,&iter1);
    if (bVar1) {
      num._3_1_ = true;
    }
    else {
      ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*(&iterend);
      num._3_1_ = PcodeOp::isBlockStart(*ppPVar4);
    }
    OVar3 = PcodeOp::code(targ_op);
    switch(OVar3) {
    case CPUI_BRANCH:
      jt = (JumpTable *)branchTarget(this,targ_op);
      std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                (&this->block_edge1,&targ_op);
      std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                (&this->block_edge2,(value_type *)&jt);
      break;
    case CPUI_CBRANCH:
      jt = (JumpTable *)fallthruOp(this,targ_op);
      std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                (&this->block_edge1,&targ_op);
      std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                (&this->block_edge2,(value_type *)&jt);
      jt = (JumpTable *)branchTarget(this,targ_op);
      std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                (&this->block_edge1,&targ_op);
      std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                (&this->block_edge2,(value_type *)&jt);
      break;
    case CPUI_BRANCHIND:
      _i = Funcdata::findJumpTable(this->data,targ_op);
      if (_i != (JumpTable *)0x0) {
        local_54 = JumpTable::numEntries(_i);
        for (local_50 = 0; local_50 < local_54; local_50 = local_50 + 1) {
          JumpTable::getAddressByIndex((JumpTable *)local_b8,(int4)_i);
          jt = (JumpTable *)target(this,(Address *)local_b8);
          bVar1 = PcodeOp::isMark((PcodeOp *)jt);
          if (!bVar1) {
            PcodeOp::setMark((PcodeOp *)jt);
            std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                      (&this->block_edge1,&targ_op);
            std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                      (&this->block_edge2,(value_type *)&jt);
          }
        }
        local_c8._M_node =
             (_List_node_base *)
             std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::end(&this->block_edge1);
        std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_c0,&local_c8);
        iter2._M_node = local_c0._M_node;
        local_d8._M_node =
             (_List_node_base *)
             std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::end(&this->block_edge2);
        std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_d0,&local_d8);
        op = (PcodeOp *)local_d0._M_node;
        while( true ) {
          local_e8._M_node =
               (_List_node_base *)
               std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::begin(&this->block_edge1);
          std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_e0,&local_e8);
          bVar1 = std::operator!=(&iter2,&local_e0);
          if (!bVar1) break;
          std::_List_const_iterator<PcodeOp_*>::operator--(&iter2);
          std::_List_const_iterator<PcodeOp_*>::operator--((_List_const_iterator<PcodeOp_*> *)&op);
          ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*(&iter2);
          if (*ppPVar4 != targ_op) break;
          ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*
                              ((_List_const_iterator<PcodeOp_*> *)&op);
          PcodeOp::clearMark(*ppPVar4);
        }
      }
      break;
    default:
      if ((num._3_1_ & 1) != 0) {
        jt = (JumpTable *)fallthruOp(this,targ_op);
        std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                  (&this->block_edge1,&targ_op);
        std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back
                  (&this->block_edge2,(value_type *)&jt);
      }
      break;
    case CPUI_RETURN:
    }
  } while( true );
}

Assistant:

void FlowInfo::collectEdges(void)

{
  list<PcodeOp *>::const_iterator iter,iterend,iter1,iter2;
  PcodeOp *op,*targ_op;
  JumpTable *jt;
  bool nextstart;
  int4 i,num;

  if (bblocks.getSize() != 0)
    throw RecovError("Basic blocks already calculated\n");

  iter = obank.beginDead();
  iterend = obank.endDead();
  while(iter!=iterend) {
    op = *iter++;
    if (iter==iterend)
      nextstart = true;
    else
      nextstart = (*iter)->isBlockStart();
    switch(op->code()) {
    case CPUI_BRANCH:
      targ_op = branchTarget(op);
      block_edge1.push_back(op);
      //      block_edge2.push_back(op->Input(0)->getAddr().Iop());
      block_edge2.push_back(targ_op);
      break;
    case CPUI_BRANCHIND:
      jt = data.findJumpTable(op);
      if (jt == (JumpTable *)0) break;
				// If we are in this routine and there is no table
				// Then we must be doing partial flow analysis
				// so assume there are no branches out
      num = jt->numEntries();
      for(i=0;i<num;++i) {
	targ_op = target(jt->getAddressByIndex(i));
	if (targ_op->isMark()) continue; // Already a link between these blocks
	targ_op->setMark();
	block_edge1.push_back(op);
	block_edge2.push_back(targ_op);
      }
      iter1 = block_edge1.end(); // Clean up our marks
      iter2 = block_edge2.end();
      while(iter1 != block_edge1.begin()) {
	--iter1;
	--iter2;
	if ((*iter1)==op)
	  (*iter2)->clearMark();
	else
	  break;
      }
      break;
    case CPUI_RETURN:
      break;
    case CPUI_CBRANCH:
      targ_op = fallthruOp(op); // Put in fallthru edge
      block_edge1.push_back(op);
      block_edge2.push_back(targ_op);
      targ_op = branchTarget(op);
      block_edge1.push_back(op);
      block_edge2.push_back(targ_op);
      break;
    default:
      if (nextstart) {		// Put in fallthru edge if new basic block
	targ_op = fallthruOp(op);
	block_edge1.push_back(op);
	block_edge2.push_back(targ_op);
      }
      break;
    }
  }
}